

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Record.cpp
# Opt level: O1

string * __thiscall gtar::Record::getPath_abi_cxx11_(string *__return_storage_ptr__,Record *this)

{
  size_type sVar1;
  ulong uVar2;
  ostream *poVar3;
  long lVar4;
  char *pcVar5;
  stringstream result;
  stringstream fullName;
  char local_359;
  char local_358;
  undefined7 uStack_357;
  long local_350;
  long local_348 [2];
  stringstream local_338 [16];
  ostream local_328 [112];
  ios_base aiStack_2b8 [264];
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base aiStack_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a0,(this->m_name)._M_dataplus._M_p,(this->m_name)._M_string_length);
  if (this->m_resolution != Text) {
    uVar2 = (ulong)this->m_format;
    if (uVar2 < 7) {
      pcVar5 = &DAT_001a63d0 + *(int *)(&DAT_001a63d0 + uVar2 * 4);
      lVar4 = *(long *)(&DAT_001a63f0 + uVar2 * 8);
    }
    else {
      lVar4 = 3;
      pcVar5 = ".u8";
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0,pcVar5,lVar4);
  }
  if (this->m_resolution == Uniform) {
    pcVar5 = ".uni";
  }
  else {
    if (this->m_resolution != Individual) goto LAB_0010e4cc;
    pcVar5 = ".ind";
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,pcVar5,4);
LAB_0010e4cc:
  std::__cxx11::stringstream::stringstream(local_338);
  sVar1 = (this->m_group)._M_string_length;
  if (sVar1 != 0) {
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_328,(this->m_group)._M_dataplus._M_p,sVar1);
    local_358 = '/';
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_358,1);
  }
  if (this->m_behavior == Discrete) {
    std::__ostream_insert<char,std::char_traits<char>>(local_328,"frames/",7);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_328,(this->m_index)._M_dataplus._M_p,(this->m_index)._M_string_length)
    ;
    local_358 = '/';
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_358,1);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,(char *)CONCAT71(uStack_357,local_358),local_350);
  }
  else if (this->m_behavior == Continuous) {
    std::__ostream_insert<char,std::char_traits<char>>(local_328,"vars/",5);
    std::__cxx11::stringbuf::str();
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_328,(char *)CONCAT71(uStack_357,local_358),local_350);
    local_359 = '/';
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_359,1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,(this->m_index)._M_dataplus._M_p,(this->m_index)._M_string_length);
  }
  else {
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              (local_328,(char *)CONCAT71(uStack_357,local_358),local_350);
  }
  if ((long *)CONCAT71(uStack_357,local_358) != local_348) {
    operator_delete((long *)CONCAT71(uStack_357,local_358),local_348[0] + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_338);
  std::ios_base::~ios_base(aiStack_2b8);
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(aiStack_130);
  return __return_storage_ptr__;
}

Assistant:

string Record::getPath() const
    {
        stringstream fullName;
        fullName << m_name;

        if(m_resolution != Text)
        {
            switch(m_format)
            {
            case Float32:
                fullName << ".f32";
                break;
            case Float64:
                fullName << ".f64";
                break;
            case Int32:
                fullName << ".i32";
                break;
            case Int64:
                fullName << ".i64";
                break;
            case UInt32:
                fullName << ".u32";
                break;
            case UInt64:
                fullName << ".u64";
                break;
            case UInt8:
            default:
                fullName << ".u8";
            }
        }

        switch(m_resolution)
        {
        case Uniform:
            fullName << ".uni";
            break;
        case Individual:
            fullName << ".ind";
            break;
        case Text:
            // not handled
            break;
        }

        stringstream result;

        if(m_group.size())
            result << m_group << '/';

        switch(m_behavior)
        {
        case Continuous:
            result << "vars/" << fullName.str() << '/' << m_index;
            break;
        case Discrete:
            result << "frames/" << m_index << '/' << fullName.str();
            break;
        case Constant:
        default:
            result << fullName.str();
        }

        return result.str();
    }